

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

mir_llong get_arr_type_size(type *arr_type)

{
  int iVar1;
  node_t pnVar2;
  byte *pbVar3;
  mir_llong mVar4;
  
  if (arr_type->mode == TM_ARR) {
    pnVar2 = (((arr_type->u).tag_type)->op_link).next;
    mVar4 = -1;
    if ((pnVar2->code != N_IGNORE) && (pbVar3 = (byte *)pnVar2->attr, (*pbVar3 & 1) != 0)) {
      iVar1 = *(int *)(*(long *)(pbVar3 + 0x18) + 0x18);
      if ((iVar1 == 2) ||
         ((iVar1 == 1 && (0xfffffff3 < *(int *)(*(long *)(pbVar3 + 0x18) + 0x30) - 0xeU)))) {
        mVar4 = *(mir_llong *)(pbVar3 + 0x30);
      }
    }
    return mVar4;
  }
  __assert_fail("arr_type->mode == TM_ARR",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x1de3,"mir_llong get_arr_type_size(struct type *)");
}

Assistant:

static mir_llong get_arr_type_size (struct type *arr_type) {
  node_t size_node;
  struct expr *sexpr;

  assert (arr_type->mode == TM_ARR);
  size_node = arr_type->u.arr_type->size;
  sexpr = size_node->attr;
  return (size_node->code != N_IGNORE && sexpr->const_p && integer_type_p (sexpr->type)
            ? sexpr->c.i_val
            : -1);
}